

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O2

void test_next_bits_iterate(void)

{
  bitset_t *pbVar1;
  size_t sVar2;
  unsigned_long uVar3;
  int i;
  size_t sVar4;
  ulong uVar5;
  unsigned_long a;
  size_t local_58;
  bitset_t *local_50;
  size_t buffer [3];
  
  pbVar1 = bitset_create();
  for (sVar4 = 0; sVar4 != 100; sVar4 = sVar4 + 1) {
    bitset_set(pbVar1,sVar4);
  }
  for (uVar5 = 1000; uVar5 < 0x44c; uVar5 = uVar5 + 2) {
    bitset_set(pbVar1,uVar5);
  }
  local_58 = 0;
  a = 0;
  local_50 = pbVar1;
  while( true ) {
    pbVar1 = local_50;
    sVar4 = bitset_next_set_bits(local_50,buffer,3,&local_58);
    if (sVar4 == 0) break;
    uVar3 = a * 2 + 800;
    for (sVar2 = 0; uVar5 = a + sVar2, sVar4 != sVar2; sVar2 = sVar2 + 1) {
      if (99 < uVar5) {
        uVar5 = uVar3;
      }
      _assert_int_equal(buffer[sVar2],uVar5,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                        ,0x33);
      uVar3 = uVar3 + 2;
    }
    local_58 = local_58 + 1;
    a = uVar5;
  }
  _assert_int_equal(a,0x96,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                    ,0x37);
  bitset_free(pbVar1);
  return;
}

Assistant:

DEFINE_TEST(test_next_bits_iterate) {
    bitset_t *b = bitset_create();
    for (int i = 0; i < 100; i++) bitset_set(b, i);
    for (int i = 1000; i < 1100; i += 2) bitset_set(b, i);

    // Use an odd, small buffer size
    size_t buffer[3];
    size_t howmany = 0;
    size_t i = 0;
    for (size_t startfrom = 0;
         (howmany = bitset_next_set_bits(
              b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
         startfrom++) {
        for (size_t j = 0; j < howmany; j++) {
            size_t expected;
            if (i < 100) {
                expected = i;
            } else {
                expected = 1000 + 2 * (i - 100);
            }
            assert_int_equal(buffer[j], expected);
            ++i;
        }
    }
    assert_int_equal(i, 150);
    bitset_free(b);
}